

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  bool *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  char *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  key_equal *in_stack_fffffffffffffb38;
  Type TVar4;
  string *s;
  hasher *in_stack_fffffffffffffb40;
  size_type in_stack_fffffffffffffb48;
  size_t sVar5;
  HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb50;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  char *in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  AssertHelper *in_stack_fffffffffffffb90;
  AssertionResult local_3f8 [2];
  AssertionResult local_3d8;
  string local_3c8 [55];
  undefined1 local_391;
  AssertionResult local_390;
  StringIO local_380;
  string local_378;
  allocator local_341;
  string local_340 [32];
  AssertionResult local_320 [2];
  allocator local_2f9;
  string local_2f8 [32];
  AssertionResult local_2d8 [2];
  int local_2b8;
  undefined4 local_2b4;
  AssertionResult local_2b0 [2];
  size_t local_290;
  AssertionResult local_288;
  char local_278 [40];
  undefined8 local_250;
  AssertionResult local_248;
  size_t local_238;
  string local_230 [55];
  undefined1 local_1f9;
  AssertionResult local_1f8;
  string local_1e8 [55];
  undefined1 local_1b1;
  AssertionResult local_1b0;
  string local_1a0 [55];
  undefined1 local_169;
  AssertionResult local_168;
  FILE *local_158;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [48];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_f0;
  Hasher local_e0;
  Hasher local_d4;
  HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  local_c8;
  
  Hasher::Hasher(&local_d4,0);
  Hasher::Hasher(&local_e0,0);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_f0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb38,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
  TVar4 = (Type)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,anon_var_dwarf_14da82,0x18,&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"$hu1",0x14,&local_149);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  bVar1 = google::
          HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite(&local_c8);
  if (bVar1) {
    local_158 = tmpfile();
    local_169 = local_158 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (type *)0xfc2886);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_1a0);
      testing::Message::~Message((Message *)0xfc29d7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc2a6b);
    local_1b1 = google::
                HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                ::write_metadata<_IO_FILE>(&local_c8,(_IO_FILE *)local_158);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (type *)0xfc2ab2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_1e8);
      testing::Message::~Message((Message *)0xfc2b87);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc2c1b);
    local_1f9 = google::
                HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                ::write_nopointer_data<_IO_FILE>(&local_c8,(_IO_FILE *)local_158);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (type *)0xfc2c62);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_230);
      testing::Message::~Message((Message *)0xfc2d37);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc2dce);
    local_238 = ftell(local_158);
    rewind(local_158);
    local_250 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xfc2e83);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfc2ee6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc2f57);
    local_290 = fread(local_278,1,local_238,local_158);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb90 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfc3006);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfc3069);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc30da);
    local_2b4 = 0xffffffff;
    in_stack_fffffffffffffb8c = fgetc(local_158);
    local_2b8 = in_stack_fffffffffffffb8c;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
               (int *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (int *)in_stack_fffffffffffffb10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb80 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfc317c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfc31d9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc324a);
    fclose(local_158);
    in_stack_fffffffffffffb74 = (int)local_278[0];
    in_stack_fffffffffffffb78 = (char *)std::__cxx11::string::operator[]((ulong)local_120);
    sVar5 = local_238;
    if (in_stack_fffffffffffffb74 == *in_stack_fffffffffffffb78) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,local_278,sVar5,&local_2f9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        testing::AssertionResult::failure_message((AssertionResult *)0xfc33a7);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                   (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfc3404);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc346f);
    }
    else {
      paVar6 = &local_341;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,local_278,sVar5,paVar6);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_320);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        in_stack_fffffffffffffb40 =
             (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xfc358a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                   (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),in_stack_fffffffffffffb20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfc35e7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc3652);
    }
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  bVar1 = google::
          HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization(&local_c8);
  if (bVar1) {
    s = &local_378;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_380,s);
    TVar4 = (Type)((ulong)s >> 0x20);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<std::__cxx11::string>,StringIO>
                      (&local_c8.
                        super_BaseHashtableInterface<google::dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                       ,&local_380);
    local_391 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (type *)0xfc36e5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                 (char *)CONCAT17(uVar2,in_stack_fffffffffffffb30),iVar3,in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_3c8);
      testing::Message::~Message((Message *)0xfc37c1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc3858);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_378);
    iVar3 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_120);
    if (iVar3 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar3,in_stack_fffffffffffffb18),in_stack_fffffffffffffb10);
      iVar3 = (int)((ulong)lhs_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfc391b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffffb30),iVar3,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfc3978);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc39e3);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar3,in_stack_fffffffffffffb18),in_stack_fffffffffffffb10);
      iVar3 = (int)((ulong)lhs_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        testing::AssertionResult::failure_message((AssertionResult *)0xfc3a5b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb40,TVar4,
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffffb30),iVar3,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfc3ab6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfc3b21);
    }
    std::__cxx11::string::~string((string *)&local_378);
  }
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  google::
  HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xfc3b77);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}